

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  ImGuiWindow *pIVar6;
  ImGuiWindow *pIVar7;
  ulong uVar8;
  byte bVar9;
  ulong extraout_RDX;
  ImGuiPopupData *pIVar10;
  ulong uVar11;
  ulong uVar12;
  ImGuiContext *g;
  bool bVar13;
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [64];
  undefined8 in_XMM1_Qb;
  ImRect IVar16;
  undefined1 auVar15 [56];
  
  pIVar5 = GImGui;
  auVar15 = in_ZMM0._8_56_;
  if (GImGui->ActiveId != 0) {
    return;
  }
  if (GImGui->HoveredId != 0) {
    return;
  }
  pIVar6 = GImGui->NavWindow;
  if ((pIVar6 != (ImGuiWindow *)0x0) && (pIVar6->Appearing != false)) {
    return;
  }
  if ((GImGui->IO).MouseClicked[0] != true) goto LAB_00150f88;
  pIVar7 = GImGui->HoveredRootWindow;
  if ((pIVar7 == (ImGuiWindow *)0x0) || ((pIVar7->Flags & 0x4000000) == 0)) {
    bVar13 = false;
  }
  else {
    uVar8 = (ulong)(GImGui->OpenPopupStack).Size;
    bVar13 = 0 < (long)uVar8;
    if (0 < (long)uVar8) {
      pIVar10 = (GImGui->OpenPopupStack).Data;
      bVar13 = true;
      if (pIVar10->PopupId != pIVar7->PopupId) {
        uVar11 = 1;
        do {
          uVar12 = uVar11;
          pIVar10 = pIVar10 + 1;
          if (uVar8 == uVar12) break;
          uVar11 = uVar12 + 1;
        } while (pIVar10->PopupId != pIVar7->PopupId);
        bVar13 = uVar12 < uVar8;
      }
    }
    bVar13 = (bool)(bVar13 ^ 1);
  }
  if ((pIVar7 == (ImGuiWindow *)0x0) || (bVar13)) {
    if ((pIVar6 != (ImGuiWindow *)0x0 && pIVar7 == (ImGuiWindow *)0x0) &&
       (pIVar6 = GetTopMostPopupModal(), pIVar6 == (ImGuiWindow *)0x0)) {
      FocusWindow((ImGuiWindow *)0x0);
    }
    goto LAB_00150f88;
  }
  StartMouseMovingWindow(GImGui->HoveredWindow);
  if (((pIVar5->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((pIVar7->Flags & 1) == 0)) {
    IVar16 = ImGuiWindow::TitleBarRect(pIVar7);
    auVar14._0_8_ = IVar16.Min;
    auVar14._8_56_ = auVar15;
    fVar1 = (pIVar5->IO).MouseClickedPos[0].x;
    if (IVar16.Min.x <= fVar1) {
      fVar2 = (pIVar5->IO).MouseClickedPos[0].y;
      auVar4 = vmovshdup_avx(auVar14._0_16_);
      if (((auVar4._0_4_ <= fVar2) && (fVar1 < IVar16.Max.x)) &&
         (auVar4._8_8_ = in_XMM1_Qb, auVar4._0_4_ = IVar16.Max.x, auVar4._4_4_ = IVar16.Max.y,
         auVar4 = vmovshdup_avx(auVar4), fVar2 < auVar4._0_4_)) goto LAB_00150f73;
    }
    pIVar5->MovingWindow = (ImGuiWindow *)0x0;
  }
LAB_00150f73:
  if (pIVar5->HoveredIdDisabled == true) {
    pIVar5->MovingWindow = (ImGuiWindow *)0x0;
  }
LAB_00150f88:
  if ((pIVar5->IO).MouseClicked[1] != true) {
    return;
  }
  pIVar7 = GetTopMostPopupModal();
  pIVar6 = pIVar5->HoveredWindow;
  if (pIVar6 != (ImGuiWindow *)0x0) {
    uVar11 = (ulong)(uint)(GImGui->Windows).Size;
    uVar8 = extraout_RDX;
    while (0 < (int)uVar11) {
      pIVar3 = (GImGui->Windows).Data[uVar11 - 1];
      bVar9 = (byte)uVar8 & pIVar3 != pIVar7 | pIVar3 == pIVar6;
      uVar8 = (ulong)bVar9;
      if ((pIVar3 == pIVar7) || (uVar11 = uVar11 - 1, pIVar3 == pIVar6)) goto LAB_00150fe5;
    }
    bVar9 = 0;
LAB_00150fe5:
    if (bVar9 != 0) {
      pIVar7 = pIVar6;
    }
  }
  ClosePopupsOverWindow(pIVar7,true);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click on empty space to focus window and start moving
    // (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        // Handle the edge case of a popup being closed while clicking in its empty space.
        // If we try to focus it, FocusWindow() > ClosePopupsOverWindow() will accidentally close any parent popups because they are not linked together any more.
        ImGuiWindow* root_window = g.HoveredRootWindow;
        const bool is_closed_popup = root_window && (root_window->Flags & ImGuiWindowFlags_Popup) && !IsPopupOpen(root_window->PopupId, ImGuiPopupFlags_AnyPopupLevel);

        if (root_window != NULL && !is_closed_popup)
        {
            StartMouseMovingWindow(g.HoveredWindow); //-V595

            // Cancel moving if clicked outside of title bar
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(root_window->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!root_window->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;

            // Cancel moving if clicked over an item which was disabled or inhibited by popups (note that we know HoveredId == 0 already)
            if (g.HoveredIdDisabled)
                g.MovingWindow = NULL;
        }
        else if (root_window == NULL && g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = g.HoveredWindow && IsWindowAbove(g.HoveredWindow, modal);
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}